

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.h
# Opt level: O2

void __thiscall
PropertiesDBusInterface::PropertiesDBusInterface
          (PropertiesDBusInterface *this,QString *service,QString *path,QString *interface,
          QDBusConnection *connection,QObject *parent)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1_helper((QString *)&local_50);
  pcVar1 = QByteArray::data((QByteArray *)&local_50);
  QDBusAbstractInterface::QDBusAbstractInterface
            (&this->super_QDBusAbstractInterface,(QString *)service,(QString *)path,pcVar1,
             connection,parent);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  *(undefined ***)this = &PTR_metaObject_00113788;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PropertiesDBusInterface(const QString &service, const QString &path, const QString &interface,
                            const QDBusConnection &connection, QObject *parent = nullptr)
        : QDBusAbstractInterface(service, path, interface.toLatin1().data(), connection, parent)
    {
    }